

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
visitStore(wasm::Store__(void *this,Store *curr)

{
  uint8_t uVar1;
  Function *pFVar2;
  IString nextResult;
  IString possible;
  ExpressionProcessor *call;
  bool bVar3;
  BasicType BVar4;
  reference pvVar5;
  pointer pMVar6;
  address64_t aVar7;
  address64_t aVar8;
  Ref RVar9;
  Ref element;
  Fatal *this_00;
  Ref *pRVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar11;
  Ref in_R8;
  IString name;
  IString name_00;
  IString name_01;
  IString name_02;
  IString name_03;
  IString name_04;
  IString key;
  IString op;
  IString IVar12;
  byte local_5a1;
  bool local_589;
  Fatal local_508;
  Value *local_380;
  Value *local_378;
  ValueBuilder *local_370;
  size_t local_368;
  Ref local_360;
  Value *local_358;
  Value *local_350;
  Value *local_348;
  ValueBuilder *local_340;
  size_t local_338;
  Ref local_330;
  Value *local_328;
  Value *local_320;
  Value *local_318;
  ValueBuilder *local_310;
  size_t local_308;
  Ref local_300;
  Value *local_2f8;
  Value *local_2f0;
  Value *local_2e8;
  ValueBuilder *local_2e0;
  size_t local_2d8;
  Ref local_2d0;
  Value *local_2c8;
  Value *local_2c0;
  Value *local_2b8;
  ValueBuilder *local_2b0;
  size_t local_2a8;
  Ref local_2a0;
  Value *local_298;
  Ref local_290;
  Ref ret;
  Ref value;
  Ref ptr;
  undefined1 auStack_258 [8];
  Store fakeStore;
  string_view local_1e8;
  undefined1 local_1d8 [8];
  LocalGet getValue;
  string_view local_1a8;
  undefined1 local_198 [8];
  LocalGet getPtr;
  undefined1 local_158 [8];
  ScopedTemp value_1;
  Type local_118;
  undefined1 local_110 [8];
  ScopedTemp ptr_1;
  FindAll<wasm::MemoryGrow> local_e0;
  byte local_c1;
  FindAll<wasm::MemoryGrow> local_c0;
  byte local_a1;
  FindAll<wasm::CallIndirect> local_a0;
  byte local_81;
  FindAll<wasm::CallIndirect> local_80;
  byte local_65;
  FindAll<wasm::Call> local_58;
  FindAll<wasm::Call> local_40;
  BasicType local_24;
  Store *local_20;
  Store *curr_local;
  ExpressionProcessor *this_local;
  Ref ret_1;
  
  local_20 = curr;
  curr_local = (Store *)this;
  bVar3 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   *)(*(long *)((long)this + 0x20) + 0x78));
  local_589 = false;
  if (!bVar3) {
    pvVar5 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(*(long *)((long)this + 0x20) + 0x78),0);
    pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar5);
    aVar7 = wasm::Address::operator_cast_to_unsigned_long(&pMVar6->initial);
    pvVar5 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(*(long *)((long)this + 0x20) + 0x78),0);
    pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar5);
    aVar8 = wasm::Address::operator_cast_to_unsigned_long(&pMVar6->max);
    local_589 = false;
    if (aVar7 < aVar8) {
      local_24 = unreachable;
      local_589 = wasm::Type::operator!=
                            (&(local_20->super_SpecificExpression<(wasm::Expression::Id)13>).
                              super_Expression.type,&local_24);
    }
  }
  if (local_589 != false) {
    FindAll<wasm::Call>::FindAll(&local_40,local_20->ptr);
    bVar3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::empty(&local_40.list);
    local_65 = 0;
    local_81 = 0;
    local_a1 = 0;
    local_c1 = 0;
    ptr_1._39_1_ = 0;
    local_5a1 = 1;
    if (bVar3) {
      FindAll<wasm::Call>::FindAll(&local_58,local_20->value);
      local_65 = 1;
      bVar3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::empty(&local_58.list);
      local_5a1 = 1;
      if (bVar3) {
        FindAll<wasm::CallIndirect>::FindAll(&local_80,local_20->ptr);
        local_81 = 1;
        bVar3 = std::vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::empty
                          (&local_80.list);
        local_5a1 = 1;
        if (bVar3) {
          FindAll<wasm::CallIndirect>::FindAll(&local_a0,local_20->value);
          local_a1 = 1;
          bVar3 = std::vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::empty
                            (&local_a0.list);
          local_5a1 = 1;
          if (bVar3) {
            FindAll<wasm::MemoryGrow>::FindAll(&local_c0,local_20->ptr);
            local_c1 = 1;
            bVar3 = std::vector<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>::empty
                              (&local_c0.list);
            local_5a1 = 1;
            if (bVar3) {
              FindAll<wasm::MemoryGrow>::FindAll(&local_e0,local_20->value);
              ptr_1._39_1_ = 1;
              bVar3 = std::vector<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>::empty
                                (&local_e0.list);
              local_5a1 = bVar3 ^ 0xff;
            }
          }
        }
      }
    }
    if ((ptr_1._39_1_ & 1) != 0) {
      FindAll<wasm::MemoryGrow>::~FindAll(&local_e0);
    }
    if ((local_c1 & 1) != 0) {
      FindAll<wasm::MemoryGrow>::~FindAll(&local_c0);
    }
    if ((local_a1 & 1) != 0) {
      FindAll<wasm::CallIndirect>::~FindAll(&local_a0);
    }
    if ((local_81 & 1) != 0) {
      FindAll<wasm::CallIndirect>::~FindAll(&local_80);
    }
    if ((local_65 & 1) != 0) {
      FindAll<wasm::Call>::~FindAll(&local_58);
    }
    FindAll<wasm::Call>::~FindAll(&local_40);
    if ((local_5a1 & 1) != 0) {
      cashew::Ref::Ref((Ref *)&this_local,(Value *)0x0);
      wasm::Type::Type(&local_118,i32);
      possible.str._M_str = DAT_027e6168;
      possible.str._M_len = NO_RESULT;
      ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                ((ScopedTemp *)local_110,local_118,*this,*(Function **)((long)this + 0x18),possible)
      ;
      value_1._32_8_ =
           visitAndAssign(wasm::Expression*,wasm::Wasm2JSBuilder::processFunctionBody(wasm::
           Module*,wasm::Function*,bool)::ExpressionProcessor::ScopedTemp__
                     (this,local_20->ptr,(ScopedTemp *)local_110);
      sequenceAppend((Ref *)&this_local,(Ref)value_1._32_8_);
      IVar12.str._M_str = DAT_027e6168;
      IVar12.str._M_len = NO_RESULT;
      ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                (local_158,(Type)(local_20->value->type).id,*this,*(Function **)((long)this + 0x18),
                 IVar12);
      getPtr._16_8_ =
           visitAndAssign(wasm::Expression*,wasm::Wasm2JSBuilder::processFunctionBody(wasm::
           Module*,wasm::Function*,bool)::ExpressionProcessor::ScopedTemp__
                     (this,local_20->value,(ScopedTemp *)local_158);
      sequenceAppend((Ref *)&this_local,(Ref)getPtr._16_8_);
      LocalGet::LocalGet((LocalGet *)local_198);
      pFVar2 = *(Function **)((long)this + 0x18);
      IVar12 = processFunctionBody::ExpressionProcessor::ScopedTemp::getName
                         ((ScopedTemp *)local_110);
      wasm::Name::Name((Name *)&local_1a8,IVar12);
      getPtr.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression.type.id._0_4_ =
           Function::getLocalIndex(pFVar2,(Name)local_1a8);
      wasm::Type::Type((Type *)&getValue.index,i32);
      getPtr.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._id = getValue.index
      ;
      getPtr.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._4_4_ =
           getValue._20_4_;
      LocalGet::LocalGet((LocalGet *)local_1d8);
      pFVar2 = *(Function **)((long)this + 0x18);
      IVar12 = processFunctionBody::ExpressionProcessor::ScopedTemp::getName
                         ((ScopedTemp *)local_158);
      wasm::Name::Name((Name *)&local_1e8,IVar12);
      getValue.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression.type.id._0_4_ =
           Function::getLocalIndex(pFVar2,(Name)local_1e8);
      getValue.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._0_8_ =
           (local_20->value->type).id;
      fakeStore.memory.super_IString.str._M_len =
           (size_t)(local_20->memory).super_IString.str._M_str;
      fakeStore.value = (Expression *)(local_20->valueType).id;
      fakeStore.valueType.id = (local_20->memory).super_IString.str._M_len;
      auStack_258._0_4_ =
           (local_20->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id;
      auStack_258._4_4_ =
           *(undefined4 *)
            &(local_20->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.
             field_0x4;
      fakeStore.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression._0_8_ =
           (local_20->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id;
      fakeStore.super_SpecificExpression<(wasm::Expression::Id)13>.super_Expression.type.id =
           *(uintptr_t *)&local_20->bytes;
      fakeStore._16_8_ = (local_20->offset).addr;
      fakeStore.offset.addr = (local_20->align).addr;
      fakeStore.align.addr = *(address64_t *)&local_20->isAtomic;
      fakeStore._40_8_ = local_198;
      fakeStore.ptr = (Expression *)local_1d8;
      RVar9 = Store__(this,(Store *)auStack_258);
      sequenceAppend((Ref *)&this_local,RVar9);
      processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_158);
      processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_110);
      return (Ref)(Value *)this_local;
    }
  }
  aVar7 = wasm::Address::operator_cast_to_unsigned_long(&local_20->align);
  bVar3 = true;
  if (aVar7 != 0) {
    aVar7 = wasm::Address::operator_cast_to_unsigned_long(&local_20->align);
    bVar3 = aVar7 == local_20->bytes;
  }
  if (bVar3) {
    RVar9 = makePointer(wasm::Expression*,wasm::Address_
                      (this,local_20->ptr,(Address)(local_20->offset).addr);
    ret.inst = EXPRESSION_RESULT;
    nextResult.str._M_str = DAT_027e6178;
    nextResult.str._M_len = (size_t)EXPRESSION_RESULT;
    element = visit(wasm::Expression*,wasm::IString_(this,local_20->value,nextResult);
    cashew::Ref::Ref(&local_290,(Value *)0x0);
    BVar4 = wasm::Type::getBasic(&local_20->valueType);
    if (BVar4 == i32) {
      uVar1 = local_20->bytes;
      if (uVar1 == '\x01') {
        local_2b0 = cashew::HEAP8;
        local_2a8 = DAT_027e6658;
        name.str._M_str = extraout_RDX;
        name.str._M_len = DAT_027e6658;
        local_2a0 = cashew::ValueBuilder::makeName(cashew::HEAP8,name);
        local_2c0 = RVar9.inst;
        local_2b8 = (Value *)cashew::ValueBuilder::makePtrShift(RVar9,0);
        local_298 = (Value *)cashew::ValueBuilder::makeSub(local_2a0,(Ref)local_2b8);
        pcVar11 = extraout_RDX_00;
        local_290 = (Ref)local_298;
      }
      else if (uVar1 == '\x02') {
        local_2e0 = cashew::HEAP16;
        local_2d8 = DAT_027e6668;
        name_00.str._M_str = extraout_RDX;
        name_00.str._M_len = DAT_027e6668;
        local_2d0 = cashew::ValueBuilder::makeName(cashew::HEAP16,name_00);
        local_2f0 = RVar9.inst;
        local_2e8 = (Value *)cashew::ValueBuilder::makePtrShift(RVar9,1);
        local_2c8 = (Value *)cashew::ValueBuilder::makeSub(local_2d0,(Ref)local_2e8);
        pcVar11 = extraout_RDX_01;
        local_290 = (Ref)local_2c8;
      }
      else {
        if (uVar1 != '\x04') {
          abort();
        }
        local_310 = cashew::HEAP32;
        local_308 = DAT_027e6678;
        name_01.str._M_str = extraout_RDX;
        name_01.str._M_len = DAT_027e6678;
        local_300 = cashew::ValueBuilder::makeName(cashew::HEAP32,name_01);
        local_320 = RVar9.inst;
        local_318 = (Value *)cashew::ValueBuilder::makePtrShift(RVar9,2);
        local_2f8 = (Value *)cashew::ValueBuilder::makeSub(local_300,(Ref)local_318);
        pcVar11 = extraout_RDX_02;
        local_290 = (Ref)local_2f8;
      }
    }
    else if (BVar4 == f32) {
      local_340 = cashew::HEAPF32;
      local_338 = DAT_027e6688;
      name_02.str._M_str = extraout_RDX;
      name_02.str._M_len = DAT_027e6688;
      local_330 = cashew::ValueBuilder::makeName(cashew::HEAPF32,name_02);
      local_350 = RVar9.inst;
      local_348 = (Value *)cashew::ValueBuilder::makePtrShift(RVar9,2);
      local_328 = (Value *)cashew::ValueBuilder::makeSub(local_330,(Ref)local_348);
      pcVar11 = extraout_RDX_03;
      local_290 = (Ref)local_328;
    }
    else {
      if (BVar4 != f64) {
        Fatal::Fatal(&local_508);
        this_00 = Fatal::operator<<(&local_508,(char (*) [26])"Unhandled type in store: ");
        Fatal::operator<<(this_00,&local_20->valueType);
        Fatal::~Fatal(&local_508);
      }
      local_370 = cashew::HEAPF64;
      local_368 = DAT_027e66c8;
      name_03.str._M_str = extraout_RDX;
      name_03.str._M_len = DAT_027e66c8;
      local_360 = cashew::ValueBuilder::makeName(cashew::HEAPF64,name_03);
      local_380 = RVar9.inst;
      local_378 = (Value *)cashew::ValueBuilder::makePtrShift(RVar9,3);
      local_358 = (Value *)cashew::ValueBuilder::makeSub(local_360,(Ref)local_378);
      pcVar11 = extraout_RDX_04;
      local_290 = (Ref)local_358;
    }
    if ((local_20->isAtomic & 1U) == 0) {
      op.str._M_str = (char *)element.inst;
      op.str._M_len = DAT_027e67f8;
      this_local = (ExpressionProcessor *)
                   cashew::ValueBuilder::makeBinary
                             ((ValueBuilder *)local_290.inst,cashew::SET,op,in_R8);
    }
    else {
      name_04.str._M_str = pcVar11;
      name_04.str._M_len = DAT_027e6808;
      RVar9 = cashew::ValueBuilder::makeName(cashew::ATOMICS,name_04);
      key.str._M_str = (char *)cashew::STORE.inst;
      key.str._M_len = DAT_027e6838;
      RVar9 = cashew::ValueBuilder::makeDot(RVar9.inst,cashew::STORE,key);
      RVar9 = cashew::ValueBuilder::makeCall(RVar9);
      this_local = (ExpressionProcessor *)RVar9;
      pRVar10 = cashew::Ref::operator[](&local_290,1);
      cashew::ValueBuilder::appendToCall(RVar9,pRVar10->inst);
      call = this_local;
      pRVar10 = cashew::Ref::operator[](&local_290,2);
      cashew::ValueBuilder::appendToCall((Ref)call,pRVar10->inst);
      cashew::ValueBuilder::appendToCall((Ref)this_local,element);
    }
    return (Ref)(Value *)this_local;
  }
  __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                ,0x60d,
                "Ref wasm::Wasm2JSBuilder::processFunctionBody(Module *, Function *, bool)::ExpressionProcessor::visitStore(Store *)"
               );
}

Assistant:

Ref visitStore(Store* curr) {
      if (!module->memories.empty() &&
          module->memories[0]->initial < module->memories[0]->max &&
          curr->type != Type::unreachable) {
        // In JS, if memory grows then it is dangerous to write
        //  HEAP[f()] = ..
        // or
        //  HEAP[..] = f()
        // since if the call swaps HEAP (in a growth operation) then
        // we will not actually write to the new version (since the
        // semantics of JS mean we already looked at HEAP and have
        // decided where to assign to).
        if (!FindAll<Call>(curr->ptr).list.empty() ||
            !FindAll<Call>(curr->value).list.empty() ||
            !FindAll<CallIndirect>(curr->ptr).list.empty() ||
            !FindAll<CallIndirect>(curr->value).list.empty() ||
            !FindAll<MemoryGrow>(curr->ptr).list.empty() ||
            !FindAll<MemoryGrow>(curr->value).list.empty()) {
          Ref ret;
          ScopedTemp ptr(Type::i32, parent, func);
          sequenceAppend(ret, visitAndAssign(curr->ptr, ptr));
          ScopedTemp value(curr->value->type, parent, func);
          sequenceAppend(ret, visitAndAssign(curr->value, value));
          LocalGet getPtr;
          getPtr.index = func->getLocalIndex(ptr.getName());
          getPtr.type = Type::i32;
          LocalGet getValue;
          getValue.index = func->getLocalIndex(value.getName());
          getValue.type = curr->value->type;
          Store fakeStore = *curr;
          fakeStore.ptr = &getPtr;
          fakeStore.value = &getValue;
          sequenceAppend(ret, visitStore(&fakeStore));
          return ret;
        }
      }
      // FIXME if memory growth, store ptr cannot contain a function call
      //       also other stores to memory, check them, all makeSub's
      // Unaligned loads and stores must have been fixed up already.
      assert(curr->align == 0 || curr->align == curr->bytes);
      // normal store
      Ref ptr = makePointer(curr->ptr, curr->offset);
      Ref value = visit(curr->value, EXPRESSION_RESULT);
      Ref ret;
      switch (curr->valueType.getBasic()) {
        case Type::i32: {
          switch (curr->bytes) {
            case 1:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP8),
                                          ValueBuilder::makePtrShift(ptr, 0));
              break;
            case 2:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP16),
                                          ValueBuilder::makePtrShift(ptr, 1));
              break;
            case 4:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP32),
                                          ValueBuilder::makePtrShift(ptr, 2));
              break;
            default:
              abort();
          }
          break;
        }
        case Type::f32:
          ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAPF32),
                                      ValueBuilder::makePtrShift(ptr, 2));
          break;
        case Type::f64:
          ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAPF64),
                                      ValueBuilder::makePtrShift(ptr, 3));
          break;
        default: {
          Fatal() << "Unhandled type in store: " << curr->valueType;
        }
      }
      if (curr->isAtomic) {
        Ref call = ValueBuilder::makeCall(
          ValueBuilder::makeDot(ValueBuilder::makeName(ATOMICS), STORE));
        ValueBuilder::appendToCall(call, ret[1]);
        ValueBuilder::appendToCall(call, ret[2]);
        ValueBuilder::appendToCall(call, value);
        return call;
      }
      return ValueBuilder::makeBinary(ret, SET, value);
    }